

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

GLsizei fill_text_data(GLfloat *data,GLubyte *string,GLsizei len)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  
  if (len < 1) {
    return 0;
  }
  uVar9 = 0;
  dVar23 = 0.5;
  dVar20 = 0.5;
  iVar6 = 0;
  do {
    bVar3 = string[uVar9];
    uVar4 = font.glyphs[bVar3].codepoint;
    switch(uVar4) {
    case 7:
    case 8:
    case 0xb:
      break;
    case 9:
      iVar7 = (int)(dVar23 * 0.015625 + 2.0);
      dVar23 = (double)((float)(int)(iVar7 - (iVar7 >> 0x1f) & 0xfffffffe) * 64.0);
      break;
    case 0xc:
      dVar20 = 0.0;
    case 10:
    case 0xd:
      dVar23 = 0.0;
      break;
    default:
      if (uVar4 != 0x20) {
        dVar13 = ((double)font.glyphs[bVar3].offset_x + dVar23) * 0.015625;
        dVar14 = ((double)font.glyphs[bVar3].offset_y + dVar20) * 0.015625;
        fVar22 = font.glyphs[bVar3].s1;
        fVar1 = font.glyphs[bVar3].s0;
        fVar25 = font.glyphs[bVar3].t0;
        fVar2 = font.glyphs[bVar3].t1;
        dVar15 = round((double)fVar1 * 640.0);
        dVar21 = (dVar15 + 0.5) / 640.0;
        dVar15 = round((double)fVar22 * 640.0);
        dVar18 = (dVar15 + -0.5) / 640.0;
        fVar10 = (float)dVar18;
        fVar11 = (float)dVar21;
        dVar15 = round((double)fVar25 * 640.0);
        dVar15 = (dVar15 + 0.5) / 640.0;
        dVar16 = round((double)fVar2 * 640.0);
        dVar16 = (dVar16 + -0.5) / 640.0;
        fVar17 = (float)dVar16;
        fVar19 = (float)dVar15;
        iVar7 = font.glyphs[bVar3].width;
        iVar5 = font.glyphs[bVar3].height;
        fVar24 = (float)dVar13;
        lVar8 = (long)(iVar6 * 0x18);
        data[lVar8] = fVar24;
        fVar12 = (float)dVar14;
        data[iVar6 * 0x18 + 1] = fVar12;
        data[iVar6 * 0x18 + 2] = fVar11;
        data[iVar6 * 0x18 + 3] = fVar19;
        data[iVar6 * 0x18 + 4] = fVar24;
        fVar25 = (float)(dVar14 - (double)iVar5 * ((dVar16 - dVar15) / (double)(fVar2 - fVar25)) *
                                  0.015625);
        data[iVar6 * 0x18 + 5] = fVar25;
        data[iVar6 * 0x18 + 6] = fVar11;
        data[iVar6 * 0x18 + 7] = fVar17;
        fVar22 = (float)((double)iVar7 * ((dVar18 - dVar21) / (double)(fVar22 - fVar1)) * 0.015625 +
                        dVar13);
        data[lVar8 + 8] = fVar22;
        data[lVar8 + 9] = fVar25;
        data[lVar8 + 10] = fVar10;
        data[lVar8 + 0xb] = fVar17;
        data[lVar8 + 0xc] = fVar24;
        data[lVar8 + 0xd] = fVar12;
        data[lVar8 + 0xe] = fVar11;
        data[lVar8 + 0xf] = fVar19;
        data[lVar8 + 0x10] = fVar22;
        data[lVar8 + 0x11] = fVar25;
        data[lVar8 + 0x12] = fVar10;
        data[lVar8 + 0x13] = fVar17;
        data[lVar8 + 0x14] = fVar22;
        data[lVar8 + 0x15] = fVar12;
        data[lVar8 + 0x16] = fVar10;
        data[lVar8 + 0x17] = fVar19;
        iVar6 = iVar6 + 1;
      }
    }
    dVar23 = dVar23 + (double)font.glyphs[bVar3].advance_x;
    dVar20 = dVar20 + (double)font.glyphs[bVar3].advance_y;
    uVar9 = uVar9 + 1;
  } while ((uint)len != uVar9);
  return iVar6;
}

Assistant:

static GLsizei fill_text_data(GLfloat* data,
                              const GLubyte* string,
                              GLsizei len)
{
	double pen_x = 0.5; // position in pixel
	double pen_y = 0.5;
	double x,y,w,h;

	GLsizei num = 0;
	for(GLsizei i=0; i<len; i++) {
		const texture_glyph_t *glyph = font.glyphs + string[i];

		switch(glyph->codepoint) {
			// up, semi-up, semi-down...  x01 - 06, e1 - e6, c0 -df, f0 - ff  could mean something
			case '\f':  // back to the beginning
				pen_y = 0;
				/* FALLTHRU */
			case '\n':  // newline
			case '\r':  // carriage return
				pen_x = 0;
				/* FALLTHRU */
			case ' ':   // space
			case '\a':  // goes up :-)
			case '\v':  // vertical space
			case '\b':  // back the size of a space
				break;
			case '\t':  // tab
				pen_x = ((int) (pen_x/font.size + 2) / 2) * 2 * font.size;
				break;
			default:
				x = (pen_x + glyph->offset_x)/font.size;
				y = (pen_y + glyph->offset_y)/font.size;

				GLfloat s0 = glyph->s0, s1 = glyph->s1;
				GLfloat t0 = glyph->t0, t1 = glyph->t1;

				double rx = getMiddlePixelTex(&s0, &s1, font.tex_width);
				double ry = getMiddlePixelTex(&t0, &t1, font.tex_height);

				w = glyph->width*rx/font.size;
				h = glyph->height*ry/font.size;

				data[24*num + 0] = (GLfloat) x;
				data[24*num + 1] = (GLfloat) y;
				data[24*num + 2] = s0;
				data[24*num + 3] = t0;
				data[24*num + 4] = (GLfloat) x;
				data[24*num + 5] = (GLfloat) (y - h);
				data[24*num + 6] = s0;
				data[24*num + 7] = t1;
				data[24*num + 8] = (GLfloat) (x + w);
				data[24*num + 9] = (GLfloat) (y - h);
				data[24*num + 10] = s1;
				data[24*num + 11] = t1;
				data[24*num + 12] = (GLfloat) x;
				data[24*num + 13] = (GLfloat) y;
				data[24*num + 14] = s0;
				data[24*num + 15] = t0;
				data[24*num + 16] = (GLfloat) (x + w);
				data[24*num + 17] = (GLfloat) (y - h);
				data[24*num + 18] = s1;
				data[24*num + 19] = t1;
				data[24*num + 20] = (GLfloat) (x + w);
				data[24*num + 21] = (GLfloat) y;
				data[24*num + 22] = s1;
				data[24*num + 23] = t0;

				num++;
				break;

		}
		pen_x += glyph->advance_x;
		pen_y += glyph->advance_y;
	}

	return num;
}